

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

uint mp_eq_integer(mp_int *x,uintmax_t n)

{
  uint uVar1;
  size_t sVar2;
  uintmax_t uVar3;
  BignumInt BVar4;
  BignumInt nword;
  size_t e;
  size_t i;
  size_t nwords;
  BignumInt diff;
  uintmax_t n_local;
  mp_int *x_local;
  
  nwords = 0;
  e = 0;
  sVar2 = size_t_max(x->nw,1);
  diff = n;
  for (; e < sVar2; e = e + 1) {
    uVar3 = shift_right_by_one_word(diff);
    BVar4 = mp_word(x,e);
    nwords = BVar4 ^ diff | nwords;
    diff = uVar3;
  }
  uVar1 = normalise_to_1(nwords);
  return uVar1 ^ 1;
}

Assistant:

unsigned mp_eq_integer(mp_int *x, uintmax_t n)
{
    BignumInt diff = 0;
    size_t nwords = sizeof(n)/BIGNUM_INT_BYTES;
    for (size_t i = 0, e = size_t_max(x->nw, nwords); i < e; i++) {
        BignumInt nword = n;
        n = shift_right_by_one_word(n);
        diff |= mp_word(x, i) ^ nword;
    }
    return 1 ^ normalise_to_1(diff);   /* return 1 if diff _is_ zero */
}